

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O3

MatrixGraph newEmptyMatrixGraph(int countOfVertex,int countOfEdge)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  MatrixGraph pAVar4;
  VertexType *pVVar5;
  int **ppiVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  size_t __size;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  long lVar14;
  
  pAVar4 = (MatrixGraph)malloc(0x20);
  if (pAVar4 == (MatrixGraph)0x0) {
    __assert_fail("matrixGraph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                  ,0x3c,"MatrixGraph newEmptyMatrixGraph(int, int)");
  }
  __size = (size_t)countOfVertex;
  pVVar5 = (VertexType *)malloc(__size);
  pAVar4->vertex = pVVar5;
  ppiVar6 = (int **)malloc(__size * 8);
  pAVar4->matrix = ppiVar6;
  if (ppiVar6 != (int **)0x0) {
    if (countOfVertex < 1) {
      pAVar4->vexNum = countOfVertex;
      pAVar4->edgeNum = countOfEdge;
    }
    else {
      uVar10 = (ulong)(uint)countOfVertex;
      uVar8 = 0;
      do {
        piVar7 = (int *)malloc(__size << 2);
        ppiVar6[uVar8] = piVar7;
        if (piVar7 == (int *)0x0) {
          __assert_fail("matrixGraph->matrix[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                        ,0x43,"MatrixGraph newEmptyMatrixGraph(int, int)");
        }
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
      pAVar4->vexNum = countOfVertex;
      pAVar4->edgeNum = countOfEdge;
      auVar3 = _DAT_0010d2b0;
      auVar2 = _DAT_0010d2a0;
      auVar1 = _DAT_0010d290;
      if (0 < countOfVertex) {
        lVar9 = uVar10 - 1;
        auVar11._8_4_ = (int)lVar9;
        auVar11._0_8_ = lVar9;
        auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar8 = 0;
        auVar11 = auVar11 ^ _DAT_0010d2b0;
        do {
          piVar7 = ppiVar6[uVar8];
          lVar9 = 0;
          auVar13 = auVar2;
          auVar15 = auVar1;
          do {
            auVar16 = auVar13 ^ auVar3;
            iVar12 = auVar11._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar12 && auVar11._0_4_ < auVar16._0_4_ ||
                        iVar12 < auVar16._4_4_) & 1)) {
              *(undefined4 *)((long)piVar7 + lVar9) = 0x7fff;
            }
            if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
                auVar16._12_4_ <= auVar11._12_4_) {
              *(undefined4 *)((long)piVar7 + lVar9 + 4) = 0x7fff;
            }
            auVar16 = auVar15 ^ auVar3;
            iVar17 = auVar16._4_4_;
            if (iVar17 <= iVar12 && (iVar17 != iVar12 || auVar16._0_4_ <= auVar11._0_4_)) {
              *(undefined4 *)((long)piVar7 + lVar9 + 8) = 0x7fff;
              *(undefined4 *)((long)piVar7 + lVar9 + 0xc) = 0x7fff;
            }
            lVar14 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar14 + 4;
            lVar14 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar14 + 4;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(countOfVertex + 3U >> 2) << 4 != lVar9);
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar10);
      }
    }
    return pAVar4;
  }
  __assert_fail("matrixGraph->matrix",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                ,0x40,"MatrixGraph newEmptyMatrixGraph(int, int)");
}

Assistant:

MatrixGraph newEmptyMatrixGraph(int countOfVertex, int countOfEdge) {
    MatrixGraph matrixGraph = malloc(sizeof(struct AMG));
    assert(matrixGraph);

    matrixGraph->vertex = malloc(sizeof(VertexType) * countOfVertex);
    matrixGraph->matrix = malloc(sizeof(int *) * countOfVertex);
    assert(matrixGraph->matrix);
    for (int i = 0; i < countOfVertex; ++i) {
        matrixGraph->matrix[i] = malloc(sizeof(int) * countOfVertex);
        assert(matrixGraph->matrix[i]);
    }


    matrixGraph->vexNum = countOfVertex;
    matrixGraph->edgeNum = countOfEdge;

    // 初始化矩阵
    for (int i = 0; i < countOfVertex; ++i) {
        for (int j = 0; j < countOfVertex; ++j) {
            matrixGraph->matrix[i][j] = UNFLAG_WEIGHT_GRAPH;
        }
    }

    return matrixGraph;
}